

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

Value * DumpTarget(Value *__return_storage_ptr__,cmGeneratorTarget *target,string *config)

{
  size_t *psVar1;
  pointer *this;
  bool bVar2;
  byte bVar3;
  cmLocalGenerator *this_00;
  char *pcVar4;
  string *value;
  Value *pVVar5;
  cmListFileBacktrace *backtrace;
  ulong uVar6;
  cmMakefile *this_01;
  reference __k;
  mapped_type *this_02;
  reference pbVar7;
  cmOutputConverter *local_bf0;
  Value local_ae0;
  undefined1 local_ab8 [8];
  Value sourceGroupsValue;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_a88;
  undefined1 local_a60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includePathList;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  LanguageData *ld;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lang;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
  languageDataMap;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  allocator local_92a;
  allocator local_929;
  string local_928;
  undefined1 local_908 [8];
  string sysroot;
  Value local_8c0;
  Value local_898;
  string local_870;
  Value local_850;
  string local_828;
  Value local_808;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  cmStateSnapshot local_720;
  cmStateDirectory local_708;
  undefined1 local_6e0 [8];
  cmLinkLineComputer linkLineComputer;
  string linkPath;
  string frameworkPath;
  string linkLanguageFlags;
  string linkFlags;
  string linkLibs;
  Value local_5e0;
  Value local_5b8;
  string local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  Value local_530;
  OutputInfo *local_508;
  OutputInfo *output;
  Value local_4e0;
  string local_4b8;
  Value local_498;
  undefined1 local_470 [8];
  Value artifacts;
  Value local_420;
  cmBacktraceRange local_3f8;
  allocator local_3e1;
  string local_3e0;
  cmBacktraceRange local_3c0;
  allocator local_3a9;
  string local_3a8;
  cmBacktraceRange local_388;
  allocator local_371;
  string local_370;
  cmBacktraceRange local_350;
  allocator local_339;
  string local_338;
  undefined1 local_318 [8];
  Value statements;
  undefined1 local_2c8 [8];
  Value crossRefs;
  Value local_280;
  Value local_258;
  Value local_230;
  Value local_208;
  Value local_1e0;
  byte local_1b5;
  undefined4 local_1b4;
  Value local_1b0;
  Value local_188;
  Value local_160;
  Value local_138;
  Value local_110;
  Value local_e8;
  Value local_c0;
  undefined1 local_98 [8];
  Value ttl;
  allocator local_59;
  undefined1 local_58 [8];
  string typeName;
  TargetType type;
  cmState *state;
  cmLocalGenerator *lg;
  string *config_local;
  cmGeneratorTarget *target_local;
  Value *result;
  
  this_00 = cmGeneratorTarget::GetLocalGenerator(target);
  cmLocalGenerator::GetState(this_00);
  typeName.field_2._12_4_ = cmGeneratorTarget::GetType(target);
  pcVar4 = cmState::GetTargetTypeName(typeName.field_2._12_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,pcVar4,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  Json::Value::Value((Value *)local_98,arrayValue);
  Json::Value::Value(&local_c0,"EXECUTABLE");
  Json::Value::append((Value *)local_98,&local_c0);
  Json::Value::~Value(&local_c0);
  Json::Value::Value(&local_e8,"STATIC_LIBRARY");
  Json::Value::append((Value *)local_98,&local_e8);
  Json::Value::~Value(&local_e8);
  Json::Value::Value(&local_110,"SHARED_LIBRARY");
  Json::Value::append((Value *)local_98,&local_110);
  Json::Value::~Value(&local_110);
  Json::Value::Value(&local_138,"MODULE_LIBRARY");
  Json::Value::append((Value *)local_98,&local_138);
  Json::Value::~Value(&local_138);
  Json::Value::Value(&local_160,"OBJECT_LIBRARY");
  Json::Value::append((Value *)local_98,&local_160);
  Json::Value::~Value(&local_160);
  Json::Value::Value(&local_188,"UTILITY");
  Json::Value::append((Value *)local_98,&local_188);
  Json::Value::~Value(&local_188);
  Json::Value::Value(&local_1b0,"INTERFACE_LIBRARY");
  Json::Value::append((Value *)local_98,&local_1b0);
  Json::Value::~Value(&local_1b0);
  bVar2 = anon_unknown.dwarf_40fde::hasString((Value *)local_98,(string *)local_58);
  if ((!bVar2) || (bVar2 = cmGeneratorTarget::IsImported(target), bVar2)) {
    Json::Value::Value(__return_storage_ptr__,nullValue);
    local_1b4 = 1;
  }
  else {
    local_1b5 = 0;
    Json::Value::Value(__return_storage_ptr__,objectValue);
    value = cmGeneratorTarget::GetName_abi_cxx11_(target);
    Json::Value::Value(&local_1e0,value);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kNAME_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_1e0);
    Json::Value::~Value(&local_1e0);
    Json::Value::Value(&local_208,(string *)local_58);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kTYPE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_208);
    Json::Value::~Value(&local_208);
    pcVar4 = cmLocalGenerator::GetCurrentSourceDirectory(this_00);
    Json::Value::Value(&local_230,pcVar4);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_230);
    Json::Value::~Value(&local_230);
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(this_00);
    Json::Value::Value(&local_258,pcVar4);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_258);
    Json::Value::~Value(&local_258);
    if (typeName.field_2._12_4_ == 7) {
      local_1b5 = 1;
      local_1b4 = 1;
    }
    else {
      cmGeneratorTarget::GetFullName
                ((string *)&crossRefs.limit_,target,config,RuntimeBinaryArtifact);
      Json::Value::Value(&local_280,(string *)&crossRefs.limit_);
      pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kFULL_NAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,&local_280);
      Json::Value::~Value(&local_280);
      std::__cxx11::string::~string((string *)&crossRefs.limit_);
      Json::Value::Value((Value *)local_2c8,objectValue);
      backtrace = cmTarget::GetBacktrace(target->Target);
      DumpBacktrace((Value *)&statements.limit_,backtrace);
      pVVar5 = Json::Value::operator[]((Value *)local_2c8,&kBACKTRACE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,(Value *)&statements.limit_);
      Json::Value::~Value((Value *)&statements.limit_);
      Json::Value::Value((Value *)local_318,arrayValue);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_338,"target_compile_definitions",&local_339);
      local_350 = cmTarget::GetCompileDefinitionsBacktraces(target->Target);
      DumpBacktraceRange((Value *)local_318,&local_338,&local_350);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_370,"target_include_directories",&local_371);
      local_388 = cmTarget::GetIncludeDirectoriesBacktraces(target->Target);
      DumpBacktraceRange((Value *)local_318,&local_370,&local_388);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3a8,"target_compile_options",&local_3a9);
      local_3c0 = cmTarget::GetCompileOptionsBacktraces(target->Target);
      DumpBacktraceRange((Value *)local_318,&local_3a8,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e0,"target_link_libraries",&local_3e1);
      local_3f8 = cmTarget::GetLinkImplementationBacktraces(target->Target);
      DumpBacktraceRange((Value *)local_318,&local_3e0,&local_3f8);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      Json::Value::Value(&local_420,(Value *)local_318);
      pVVar5 = Json::Value::operator[]((Value *)local_2c8,&kRELATED_STATEMENTS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,&local_420);
      Json::Value::~Value(&local_420);
      Json::Value::Value((Value *)&artifacts.limit_,(Value *)local_2c8);
      pVVar5 = Json::Value::operator[]
                         (__return_storage_ptr__,&kTARGET_CROSS_REFERENCES_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,(Value *)&artifacts.limit_);
      Json::Value::~Value((Value *)&artifacts.limit_);
      bVar2 = cmGeneratorTarget::HaveWellDefinedOutputFiles(target);
      if (bVar2) {
        Json::Value::Value((Value *)local_470,arrayValue);
        cmGeneratorTarget::GetFullPath(&local_4b8,target,config,RuntimeBinaryArtifact,false);
        Json::Value::Value(&local_498,&local_4b8);
        Json::Value::append((Value *)local_470,&local_498);
        Json::Value::~Value(&local_498);
        std::__cxx11::string::~string((string *)&local_4b8);
        bVar2 = cmGeneratorTarget::IsDLLPlatform(target);
        if (bVar2) {
          cmGeneratorTarget::GetFullPath
                    ((string *)&output,target,config,ImportLibraryArtifact,false);
          Json::Value::Value(&local_4e0,(string *)&output);
          Json::Value::append((Value *)local_470,&local_4e0);
          Json::Value::~Value(&local_4e0);
          std::__cxx11::string::~string((string *)&output);
          local_508 = cmGeneratorTarget::GetOutputInfo(target,config);
          if (local_508 != (OutputInfo *)0x0) {
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              std::operator+(&local_570,&local_508->PdbDir,'/');
              cmGeneratorTarget::GetPDBName(&local_590,target,config);
              std::operator+(&local_550,&local_570,&local_590);
              Json::Value::Value(&local_530,&local_550);
              Json::Value::append((Value *)local_470,&local_530);
              Json::Value::~Value(&local_530);
              std::__cxx11::string::~string((string *)&local_550);
              std::__cxx11::string::~string((string *)&local_590);
              std::__cxx11::string::~string((string *)&local_570);
            }
          }
        }
        Json::Value::Value(&local_5b8,(Value *)local_470);
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kARTIFACTS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar5,&local_5b8);
        Json::Value::~Value(&local_5b8);
        cmGeneratorTarget::GetLinkerLanguage((string *)((long)&linkLibs.field_2 + 8),target,config);
        Json::Value::Value(&local_5e0,(string *)((long)&linkLibs.field_2 + 8));
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kLINKER_LANGUAGE_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar5,&local_5e0);
        Json::Value::~Value(&local_5e0);
        std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(linkLanguageFlags.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&linkLineComputer.ForResponse);
        local_bf0 = (cmOutputConverter *)0x0;
        if (this_00 != (cmLocalGenerator *)0x0) {
          local_bf0 = &this_00->super_cmOutputConverter;
        }
        cmLocalGenerator::GetStateSnapshot(&local_720,this_00);
        cmStateSnapshot::GetDirectory(&local_708,&local_720);
        cmLinkLineComputer::cmLinkLineComputer((cmLinkLineComputer *)local_6e0,local_bf0,&local_708)
        ;
        cmLocalGenerator::GetTargetFlags
                  (this_00,(cmLinkLineComputer *)local_6e0,config,
                   (string *)((long)&linkFlags.field_2 + 8),
                   (string *)((long)&frameworkPath.field_2 + 8),
                   (string *)((long)&linkLanguageFlags.field_2 + 8),
                   (string *)((long)&linkPath.field_2 + 8),(string *)&linkLineComputer.ForResponse,
                   target);
        cmSystemTools::TrimWhitespace(&local_740,(string *)((long)&linkFlags.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(linkFlags.field_2._M_local_buf + 8),(string *)&local_740);
        std::__cxx11::string::~string((string *)&local_740);
        cmSystemTools::TrimWhitespace(&local_760,(string *)((long)&linkLanguageFlags.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(linkLanguageFlags.field_2._M_local_buf + 8),(string *)&local_760);
        std::__cxx11::string::~string((string *)&local_760);
        cmSystemTools::TrimWhitespace(&local_780,(string *)((long)&frameworkPath.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_780);
        std::__cxx11::string::~string((string *)&local_780);
        cmSystemTools::TrimWhitespace(&local_7a0,(string *)((long)&linkPath.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(linkPath.field_2._M_local_buf + 8),(string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_7a0);
        cmSystemTools::TrimWhitespace(&local_7c0,(string *)&linkLineComputer.ForResponse);
        std::__cxx11::string::operator=
                  ((string *)&linkLineComputer.ForResponse,(string *)&local_7c0);
        std::__cxx11::string::~string((string *)&local_7c0);
        cmSystemTools::TrimWhitespace(&local_7e0,(string *)((long)&linkFlags.field_2 + 8));
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_7e0);
        if (((bVar3 ^ 0xff) & 1) != 0) {
          Json::Value::Value(&local_808,(string *)((long)&linkFlags.field_2 + 8));
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kLINK_LIBRARIES_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_808);
          Json::Value::~Value(&local_808);
        }
        cmSystemTools::TrimWhitespace(&local_828,(string *)((long)&linkLanguageFlags.field_2 + 8));
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_828);
        if (((bVar3 ^ 0xff) & 1) != 0) {
          Json::Value::Value(&local_850,(string *)((long)&linkLanguageFlags.field_2 + 8));
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kLINK_FLAGS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_850);
          Json::Value::~Value(&local_850);
        }
        cmSystemTools::TrimWhitespace(&local_870,(string *)((long)&frameworkPath.field_2 + 8));
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_870);
        if (((bVar3 ^ 0xff) & 1) != 0) {
          Json::Value::Value(&local_898,(string *)((long)&frameworkPath.field_2 + 8));
          pVVar5 = Json::Value::operator[]
                             (__return_storage_ptr__,&kLINK_LANGUAGE_FLAGS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_898);
          Json::Value::~Value(&local_898);
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          Json::Value::Value(&local_8c0,(string *)((long)&linkPath.field_2 + 8));
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kFRAMEWORK_PATH_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_8c0);
          Json::Value::~Value(&local_8c0);
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          Json::Value::Value((Value *)((long)&sysroot.field_2 + 8),
                             (string *)&linkLineComputer.ForResponse);
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kLINK_PATH_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,(Value *)((long)&sysroot.field_2 + 8));
          Json::Value::~Value((Value *)((long)&sysroot.field_2 + 8));
        }
        this_01 = cmLocalGenerator::GetMakefile(this_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_928,"CMAKE_SYSROOT",&local_929);
        pcVar4 = cmMakefile::GetSafeDefinition(this_01,&local_928);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_908,pcVar4,&local_92a);
        std::allocator<char>::~allocator((allocator<char> *)&local_92a);
        std::__cxx11::string::~string((string *)&local_928);
        std::allocator<char>::~allocator((allocator<char> *)&local_929);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          Json::Value::Value((Value *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (string *)local_908);
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kSYSROOT_KEY_abi_cxx11_);
          Json::Value::operator=
                    (pVVar5,(Value *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
          Json::Value::~Value((Value *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        std::__cxx11::string::~string((string *)local_908);
        cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)local_6e0);
        std::__cxx11::string::~string((string *)&linkLineComputer.ForResponse);
        std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(linkLanguageFlags.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
        Json::Value::~Value((Value *)local_470);
      }
      psVar1 = &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)psVar1);
      cmGeneratorTarget::GetLanguages
                (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)psVar1,config);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
             *)&__range1);
      psVar1 = &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)psVar1);
      lang = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
      while( true ) {
        bVar2 = std::operator!=(&__end1,(_Self *)&lang);
        if (!bVar2) break;
        __k = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&__end1);
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                                *)&__range1,__k);
        std::__cxx11::string::operator=((string *)&this_02->Language,(string *)__k);
        cmLocalGenerator::GetTargetCompileFlags(this_00,target,config,__k,&this_02->Flags);
        this = &includePathList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
        cmLocalGenerator::GetTargetDefines
                  (this_00,target,config,__k,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
        LanguageData::SetDefines
                  (this_02,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&includePathList.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
        cmLocalGenerator::GetIncludeDirectories
                  (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2,target,__k,config,true);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2);
        i.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&i.field_2 + 8));
          if (!bVar2) break;
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
          std::__cxx11::string::string((string *)local_a60,(string *)pbVar7);
          sourceGroupsValue.limit_._7_1_ =
               cmGeneratorTarget::IsSystemIncludeDirectory(target,(string *)local_a60,config);
          std::make_pair<std::__cxx11::string&,bool>
                    (&local_a88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a60,
                     (bool *)((long)&sourceGroupsValue.limit_ + 7));
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::push_back(&this_02->IncludePathList,&local_a88);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
          ::~pair(&local_a88);
          std::__cxx11::string::~string((string *)local_a60);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&includePathList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      DumpSourceFilesList((Value *)local_ab8,target,config,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                           *)&__range1);
      bVar2 = Json::Value::empty((Value *)local_ab8);
      if (!bVar2) {
        Json::Value::Value(&local_ae0,(Value *)local_ab8);
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kFILE_GROUPS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar5,&local_ae0);
        Json::Value::~Value(&local_ae0);
      }
      local_1b5 = 1;
      local_1b4 = 1;
      Json::Value::~Value((Value *)local_ab8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
              *)&__range1);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Json::Value::~Value((Value *)local_318);
      Json::Value::~Value((Value *)local_2c8);
    }
    if ((local_1b5 & 1) == 0) {
      Json::Value::~Value(__return_storage_ptr__);
    }
  }
  Json::Value::~Value((Value *)local_98);
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpTarget(cmGeneratorTarget* target,
                              const std::string& config)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();
  const cmState* state = lg->GetState();

  const cmStateEnums::TargetType type = target->GetType();
  const std::string typeName = state->GetTargetTypeName(type);

  Json::Value ttl = Json::arrayValue;
  ttl.append("EXECUTABLE");
  ttl.append("STATIC_LIBRARY");
  ttl.append("SHARED_LIBRARY");
  ttl.append("MODULE_LIBRARY");
  ttl.append("OBJECT_LIBRARY");
  ttl.append("UTILITY");
  ttl.append("INTERFACE_LIBRARY");

  if (!hasString(ttl, typeName) || target->IsImported()) {
    return Json::Value();
  }

  Json::Value result = Json::objectValue;
  result[kNAME_KEY] = target->GetName();
  result[kTYPE_KEY] = typeName;
  result[kSOURCE_DIRECTORY_KEY] = lg->GetCurrentSourceDirectory();
  result[kBUILD_DIRECTORY_KEY] = lg->GetCurrentBinaryDirectory();

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    return result;
  }

  result[kFULL_NAME_KEY] = target->GetFullName(config);

  Json::Value crossRefs = Json::objectValue;
  crossRefs[kBACKTRACE_KEY] = DumpBacktrace(target->Target->GetBacktrace());

  Json::Value statements = Json::arrayValue;
  DumpBacktraceRange(statements, "target_compile_definitions",
                     target->Target->GetCompileDefinitionsBacktraces());
  DumpBacktraceRange(statements, "target_include_directories",
                     target->Target->GetIncludeDirectoriesBacktraces());
  DumpBacktraceRange(statements, "target_compile_options",
                     target->Target->GetCompileOptionsBacktraces());
  DumpBacktraceRange(statements, "target_link_libraries",
                     target->Target->GetLinkImplementationBacktraces());

  crossRefs[kRELATED_STATEMENTS_KEY] = std::move(statements);
  result[kTARGET_CROSS_REFERENCES_KEY] = std::move(crossRefs);

  if (target->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = Json::arrayValue;
    artifacts.append(
      target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact));
    if (target->IsDLLPlatform()) {
      artifacts.append(
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));
      const cmGeneratorTarget::OutputInfo* output =
        target->GetOutputInfo(config);
      if (output && !output->PdbDir.empty()) {
        artifacts.append(output->PdbDir + '/' + target->GetPDBName(config));
      }
    }
    result[kARTIFACTS_KEY] = artifacts;

    result[kLINKER_LANGUAGE_KEY] = target->GetLinkerLanguage(config);

    std::string linkLibs;
    std::string linkFlags;
    std::string linkLanguageFlags;
    std::string frameworkPath;
    std::string linkPath;
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, config, linkLibs, linkLanguageFlags,
                       linkFlags, frameworkPath, linkPath, target);

    linkLibs = cmSystemTools::TrimWhitespace(linkLibs);
    linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
    linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
    frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
    linkPath = cmSystemTools::TrimWhitespace(linkPath);

    if (!cmSystemTools::TrimWhitespace(linkLibs).empty()) {
      result[kLINK_LIBRARIES_KEY] = linkLibs;
    }
    if (!cmSystemTools::TrimWhitespace(linkFlags).empty()) {
      result[kLINK_FLAGS_KEY] = linkFlags;
    }
    if (!cmSystemTools::TrimWhitespace(linkLanguageFlags).empty()) {
      result[kLINK_LANGUAGE_FLAGS_KEY] = linkLanguageFlags;
    }
    if (!frameworkPath.empty()) {
      result[kFRAMEWORK_PATH_KEY] = frameworkPath;
    }
    if (!linkPath.empty()) {
      result[kLINK_PATH_KEY] = linkPath;
    }
    const std::string sysroot =
      lg->GetMakefile()->GetSafeDefinition("CMAKE_SYSROOT");
    if (!sysroot.empty()) {
      result[kSYSROOT_KEY] = sysroot;
    }
  }

  std::set<std::string> languages;
  target->GetLanguages(languages, config);
  std::map<std::string, LanguageData> languageDataMap;
  for (const auto& lang : languages) {
    LanguageData& ld = languageDataMap[lang];
    ld.Language = lang;
    lg->GetTargetCompileFlags(target, config, lang, ld.Flags);
    std::set<std::string> defines;
    lg->GetTargetDefines(target, config, lang, defines);
    ld.SetDefines(defines);
    std::vector<std::string> includePathList;
    lg->GetIncludeDirectories(includePathList, target, lang, config, true);
    for (auto i : includePathList) {
      ld.IncludePathList.push_back(
        std::make_pair(i, target->IsSystemIncludeDirectory(i, config)));
    }
  }

  Json::Value sourceGroupsValue =
    DumpSourceFilesList(target, config, languageDataMap);
  if (!sourceGroupsValue.empty()) {
    result[kFILE_GROUPS_KEY] = sourceGroupsValue;
  }

  return result;
}